

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

uint stb_vorbis_get_file_offset(stb_vorbis *f)

{
  long lVar1;
  long in_RDI;
  undefined4 local_4;
  
  if (*(char *)(in_RDI + 0x5c) == '\0') {
    if (*(long *)(in_RDI + 0x40) == 0) {
      lVar1 = ftell(*(FILE **)(in_RDI + 0x30));
      local_4 = (int)lVar1 - *(int *)(in_RDI + 0x38);
    }
    else {
      local_4 = (int)*(undefined8 *)(in_RDI + 0x40) - (int)*(undefined8 *)(in_RDI + 0x48);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

unsigned int stb_vorbis_get_file_offset(stb_vorbis *f)
{
   #ifndef STB_VORBIS_NO_PUSHDATA_API
   if (f->push_mode) return 0;
   #endif
   if (USE_MEMORY(f)) return (unsigned int) (f->stream - f->stream_start);
   #ifndef STB_VORBIS_NO_STDIO
   return (unsigned int) (ftell(f->f) - f->f_start);
   #endif
}